

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O1

void __thiscall sign_verify::test_method(sign_verify *this)

{
  int iVar1;
  size_t max_signature_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  size_t siglen;
  picnic3_l1_publickey_t public_key;
  array<unsigned_char,_32UL> m;
  picnic3_l1_privatekey_t private_key;
  assertion_result local_1a8;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  local_190;
  _func_int *local_180;
  pointer local_178;
  element_type *peStack_170;
  shared_count local_168 [2];
  char *local_158;
  char *local_150;
  _func_int *local_148;
  lazy_ostream local_140;
  undefined1 *local_130;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *local_128;
  assertion_result local_120;
  undefined1 local_f8 [32];
  lazy_ostream local_d8;
  undefined1 *local_c8;
  undefined1 *local_c0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  local_180 = (_func_int *)picnic3_l1_signature_size();
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x1e;
  local_140._vptr_lazy_ostream = &local_180;
  boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
            (&local_120,(value_expr<const_unsigned_long_&> *)&local_140,false);
  local_c0 = local_f8;
  local_f8._0_8_ = "max_signature_size";
  local_f8._8_8_ = "";
  local_d8.m_empty = false;
  local_d8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_40.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_120,&local_d8,&local_40,0x1e,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_120.m_message.pn);
  (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>
            ((array<unsigned_char,_32UL> *)local_f8);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x26;
  iVar1 = picnic3_l1_keygen(&local_120,&local_d8);
  local_190.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_178,(value_expr<bool> *)&local_190,false);
  local_1a8._0_8_ = "!picnic3_l1_keygen(&public_key, &private_key)";
  local_1a8.m_message.px = (element_type *)0x1595b8;
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_50.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_50.m_end = "";
  local_128 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,&local_140,&local_50,0x26,CHECK,CHECK_BUILT_ASSERTION,0)
  ;
  boost::detail::shared_count::~shared_count(local_168);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x29;
  iVar1 = picnic3_l1_validate_keypair(&local_d8,&local_120);
  local_190.m_lhs.m_value._0_1_ = iVar1 == 0;
  boost::test_tools::assertion::value_expr<bool>::evaluate
            ((assertion_result *)&local_178,(value_expr<bool> *)&local_190,false);
  local_1a8._0_8_ = "!picnic3_l1_validate_keypair(&private_key, &public_key)";
  local_1a8.m_message.px = (element_type *)0x1595f0;
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_60.m_end = "";
  local_128 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_1a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,&local_140,&local_60,0x29,CHECK,CHECK_BUILT_ASSERTION,0)
  ;
  boost::detail::shared_count::~shared_count(local_168);
  local_178 = (pointer)0x0;
  peStack_170 = (element_type *)0x0;
  local_168[0].pi_ = (sp_counted_base *)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_178,
             (size_type)local_180);
  local_148 = local_180;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x30;
  iVar1 = picnic3_l1_sign(&local_d8,local_f8,0x20,local_178,&local_148);
  local_158 = (char *)CONCAT71(local_158._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1a8,(value_expr<bool> *)&local_158,false);
  local_190.m_lhs.m_value = (unsigned_long *)0x1595f1;
  local_190.m_rhs = (unsigned_long *)0x159638;
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_128 = &local_190;
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_70.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_140,&local_70,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x31;
  local_190.m_rhs = (unsigned_long *)((ulong)local_190.m_rhs & 0xffffffff00000000);
  local_190.m_lhs.m_value = (unsigned_long *)&local_148;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
  ::evaluate(&local_1a8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
              *)&local_190,false);
  local_158 = "siglen > 0";
  local_150 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_80.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_80.m_end = "";
  local_128 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_140,&local_80,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x32;
  local_190.m_rhs = (unsigned_long *)&local_180;
  local_190.m_lhs.m_value = (unsigned_long *)&local_148;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_1a8,&local_190,false);
  local_158 = "siglen <= max_signature_size";
  local_150 = "";
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_90.m_end = "";
  local_128 = (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
               *)&local_158;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_140,&local_90,0x32,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17d8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x15efb3);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x34;
  iVar1 = picnic3_l1_verify(&local_120,local_f8,0x20,local_178,local_148);
  local_158 = (char *)CONCAT71(local_158._1_7_,iVar1 == 0);
  boost::test_tools::assertion::value_expr<bool>::evaluate
            (&local_1a8,(value_expr<bool> *)&local_158,false);
  local_190.m_lhs.m_value = (unsigned_long *)0x159661;
  local_190.m_rhs = (unsigned_long *)0x1596a8;
  local_140.m_empty = false;
  local_140._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0017ad10;
  local_130 = boost::unit_test::lazy_ostream::inst;
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  local_a0.m_end = "";
  local_128 = &local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a8,&local_140,&local_a0,0x34,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1a8.m_message.pn);
  if (local_178 != (pointer)0x0) {
    operator_delete(local_178);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
}